

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjWeakRefLookupTable::remove_stale_weak_refs(CVmObjWeakRefLookupTable *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  
  iVar2 = CVmObjTable::is_obj_deletable
                    (&G_obj_table_X,
                     (vm_val_t *)
                     ((this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_ +
                     0x10));
  if (iVar2 != 0) {
    pcVar6 = (this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
    pcVar6[0x10] = '\x01';
    pcVar6[0x11] = '\0';
    pcVar6[0x12] = '\0';
    pcVar6[0x13] = '\0';
  }
  piVar4 = (int *)(this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
  iVar2 = *piVar4;
  if (iVar2 != 0) {
    piVar4 = piVar4 + 8;
    lVar7 = 0;
    do {
      if (*(char **)piVar4 != (char *)0x0) {
        pcVar6 = *(char **)piVar4;
        pcVar8 = (char *)0x0;
        do {
          pcVar1 = *(char **)(pcVar6 + 0x20);
          iVar3 = CVmObjTable::is_obj_deletable(&G_obj_table_X,(vm_val_t *)(pcVar6 + 0x10));
          pcVar9 = pcVar6;
          if (iVar3 != 0) {
            pcVar9 = (this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
            pcVar5 = pcVar9 + lVar7 * 8;
            if (pcVar8 != (char *)0x0) {
              pcVar5 = pcVar8;
            }
            *(undefined8 *)(pcVar5 + 0x20) = *(undefined8 *)(pcVar6 + 0x20);
            *(undefined8 *)(pcVar6 + 0x20) = *(undefined8 *)(pcVar9 + 8);
            *(char **)(pcVar9 + 8) = pcVar6;
            pcVar6[0] = '\r';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[0x10] = '\r';
            pcVar6[0x11] = '\0';
            pcVar6[0x12] = '\0';
            pcVar6[0x13] = '\0';
            pcVar9 = pcVar8;
          }
          pcVar6 = pcVar1;
          pcVar8 = pcVar9;
        } while (pcVar1 != (char *)0x0);
      }
      piVar4 = piVar4 + 2;
      lVar7 = lVar7 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::remove_stale_weak_refs(VMG0_)
{
    vm_lookup_val **bucket;
    uint i;
    uint hashval;

    /* remove the default value if it's gone stale */
    if (G_obj_table->is_obj_deletable(&get_ext()->default_value))
        get_ext()->default_value.set_nil();

    /* run through each bucket */
    for (hashval = 0, bucket = get_ext()->buckets, i = get_bucket_count() ;
         i != 0 ; ++bucket, --i, ++hashval)
    {
        vm_lookup_val *entry;
        vm_lookup_val *prv;
        vm_lookup_val *nxt;

        /* run through all entries attached to this bucket */
        for (prv = 0, entry = *bucket ; entry != 0 ; entry = nxt)
        {
            /* remember the next entry, in case we delete this one */
            nxt = entry->nxt;

            /* 
             *   if the value has an object reference that has become stale,
             *   delete the entry 
             */
            if (G_obj_table->is_obj_deletable(&entry->val))
            {
                /* it's deletable, so delete the entire record */
                unlink_entry(vmg_ entry, hashval, prv);

                /* 
                 *   note that we do NOT advance the prv pointer - we've
                 *   deleted this entry, so the one preceding it is now the
                 *   previous for the one following this one 
                 */
            }
            else
            {
                /* we're keeping this entry - make it the new previous */
                prv = entry;
            }
        }
    }
}